

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nbt_parsing.c
# Opt level: O0

nbt_list * read_compound(char **memory,size_t *length)

{
  int *piVar1;
  void *pvVar2;
  char *name_00;
  long *__ptr;
  nbt_node *pnVar3;
  nbt_list *new_entry;
  char *name;
  nbt_list *pnStack_28;
  uint8_t type;
  nbt_list *ret;
  size_t *length_local;
  char **memory_local;
  
  ret = (nbt_list *)length;
  length_local = (size_t *)memory;
  pnStack_28 = (nbt_list *)malloc(0x18);
  if (pnStack_28 == (nbt_list *)0x0) {
    piVar1 = __errno_location();
    *piVar1 = -2;
  }
  else {
    pnStack_28->data = (nbt_node *)0x0;
    (pnStack_28->entry).blink = &pnStack_28->entry;
    (pnStack_28->entry).flink = &pnStack_28->entry;
    while (ret->data != (nbt_node *)0x0) {
      pvVar2 = swapped_memscan((void *)((long)&name + 7),(void *)*length_local,1);
      *length_local = (size_t)pvVar2;
      ret->data = (nbt_node *)((long)&ret->data[-1].payload + 0xf);
      if (name._7_1_ == 0) {
        return pnStack_28;
      }
      name_00 = read_string((char **)length_local,(size_t *)ret);
      if (name_00 == (char *)0x0) break;
      __ptr = (long *)malloc(0x18);
      if (__ptr == (long *)0x0) {
        piVar1 = __errno_location();
        *piVar1 = -2;
        free(name_00);
        break;
      }
      pnVar3 = parse_unnamed_tag((uint)name._7_1_,name_00,(char **)length_local,(size_t *)ret);
      *__ptr = (long)pnVar3;
      if (*__ptr == 0) {
        free(__ptr);
        free(name_00);
        break;
      }
      list_add_tail((list_head *)(__ptr + 1),&pnStack_28->entry);
    }
  }
  piVar1 = __errno_location();
  if (*piVar1 == 0) {
    piVar1 = __errno_location();
    *piVar1 = -1;
  }
  nbt_free_list(pnStack_28);
  return (nbt_list *)0x0;
}

Assistant:

static struct nbt_list* read_compound(const char** memory, size_t* length)
{
    struct nbt_list* ret;

    CHECKED_MALLOC(ret, sizeof *ret, goto parse_error);

    ret->data = NULL;
    INIT_LIST_HEAD(&ret->entry);

    for(;;)
    {
        uint8_t type;
        char* name = NULL;
        struct nbt_list* new_entry;

        READ_GENERIC(&type, sizeof type, swapped_memscan, goto parse_error);

        if(type == 0) break; /* TAG_END == 0. We've hit the end of the list when type == TAG_END. */

        name = read_string(memory, length);
        if(name == NULL) goto parse_error;

        CHECKED_MALLOC(new_entry, sizeof *new_entry,
            free(name);
            goto parse_error;
        );

        new_entry->data = parse_unnamed_tag((nbt_type)type, name, memory, length);

        if(new_entry->data == NULL)
        {
            free(new_entry);
            free(name);
            goto parse_error;
        }

        list_add_tail(&new_entry->entry, &ret->entry);
    }

    return ret;

parse_error:
    if(errno == NBT_OK)
        errno = NBT_ERR;
    nbt_free_list(ret);

    return NULL;
}